

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::NeuralNetworkShaper
          (NeuralNetworkShaper *this,ModelDescription *interface,
          RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers,
          bool useInputAndOutputConstraints)

{
  bool bVar1;
  _Self __tmp;
  Type *pTVar2;
  mapped_type *pmVar3;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  Type *pTVar4;
  _Rb_tree_node_base *p_Var5;
  iterator iVar6;
  size_t *psVar7;
  LogMessage *pLVar8;
  long *plVar9;
  undefined7 in_register_00000009;
  undefined1 *puVar10;
  int iVar11;
  int iVar12;
  undefined1 *puVar13;
  size_t sVar14;
  bool bVar15;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  blobColorsCopy;
  LogFinisher local_109;
  ModelDescription *local_108;
  undefined4 local_fc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *local_f8;
  _Rb_tree_node_base *local_f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *local_e8;
  _Base_ptr local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_fc = (undefined4)CONCAT71(in_register_00000009,useInputAndOutputConstraints);
  this->numColors = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
  local_e8 = &this->blobColors;
  local_f0 = &(this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_f0;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_f0;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8 = &this->blobShapes;
  local_e0 = &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_e0;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_e0;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl._0_4_ = 0;
  local_108 = interface;
  if (0 < (interface->input_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(interface->input_).super_RepeatedPtrFieldBase,local_d8._M_impl._0_4_);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](local_f8,(key_type *)
                                     ((ulong)(pTVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe))
      ;
      ShapeConstraint::setName
                (pmVar3,(string *)((ulong)(pTVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::operator[](local_e8,(key_type *)
                                      ((ulong)(pTVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
                            );
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(this_00,(int *)&local_d8);
      if ((char)local_fc != '\0') {
        puVar13 = (undefined1 *)pTVar2->type_;
        if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
          puVar13 = Specification::_FeatureType_default_instance_;
        }
        ShapeConstraint::updateConstraint(pmVar3,(FeatureType *)puVar13);
      }
      local_d8._M_impl._0_4_ = local_d8._M_impl._0_4_ + 1;
    } while ((int)local_d8._M_impl._0_4_ <
             (local_108->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  do {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::_Rb_tree(&local_d8,&local_e8->_M_t);
    iVar12 = (layers->super_RepeatedPtrFieldBase).current_size_;
    if (0 < iVar12) {
      iVar11 = 0;
      do {
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                           (&layers->super_RepeatedPtrFieldBase,iVar11);
        PassColorsDown(this,pTVar4);
        ProcessLayer(this,pTVar4);
        iVar11 = iVar11 + 1;
        iVar12 = (layers->super_RepeatedPtrFieldBase).current_size_;
      } while (iVar11 < iVar12);
    }
    while (0 < iVar12) {
      iVar12 = iVar12 + -1;
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&layers->super_RepeatedPtrFieldBase,iVar12);
      PassColorsUp(this,pTVar4);
      ProcessLayer(this,pTVar4);
    }
    p_Var5 = (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar15 = p_Var5 == local_f0;
    if (!bVar15) {
      iVar12 = this->numColors;
      if (iVar12 == *(int *)&p_Var5[3]._M_parent) {
        do {
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          bVar15 = p_Var5 == local_f0;
          if (bVar15) break;
        } while (iVar12 == *(int *)&p_Var5[3]._M_parent);
      }
      else {
        bVar15 = false;
      }
    }
    if (local_d8._M_impl.super__Rb_tree_header._M_node_count ==
        (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      bVar1 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                        ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )local_d8._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )&local_d8._M_impl.super__Rb_tree_header,
                         (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    }
    else {
      bVar1 = false;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_d8);
  } while (!bVar15 && bVar1 == false);
  if (((char)local_fc != '\0') &&
     (0 < (local_108->output_).super_RepeatedPtrFieldBase.current_size_)) {
    local_f0 = (_Rb_tree_node_base *)&local_108->output_;
    iVar12 = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         ((RepeatedPtrFieldBase *)local_f0,iVar12);
      iVar11 = std::__cxx11::string::compare
                         ((string *)((ulong)(pTVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      if (((iVar11 != 0) &&
          (iVar11 = std::__cxx11::string::compare
                              ((string *)
                               ((ulong)(pTVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)),
          iVar11 != 0)) &&
         (iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                  ::find(&local_f8->_M_t,
                         (key_type *)((ulong)(pTVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe))
         , iVar6._M_node != local_e0)) {
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                 ::at(local_f8,(key_type *)
                               ((ulong)(pTVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        puVar13 = (undefined1 *)pTVar2->type_;
        if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
          puVar13 = Specification::_FeatureType_default_instance_;
        }
        if (((FeatureType *)puVar13)->_oneof_case_[0] == 4) {
          iVar11 = ((((FeatureType *)puVar13)->Type_).imagetype_)->colorspace_;
          sVar14 = (ulong)(iVar11 != 10) * 2 + 1;
          if (iVar11 == 0x28) {
            sVar14 = 1;
          }
          ShapeConstraint::setChannel(pmVar3,sVar14);
          puVar13 = (undefined1 *)pTVar2->type_;
          if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
            puVar13 = Specification::_FeatureType_default_instance_;
          }
          puVar10 = Specification::_ImageFeatureType_default_instance_;
          if (((FeatureType *)puVar13)->_oneof_case_[0] == 4) {
            puVar10 = (undefined1 *)(((FeatureType *)puVar13)->Type_).imagetype_;
          }
          ShapeConstraint::setHeight(pmVar3,((ImageFeatureType *)puVar10)->height_);
          puVar13 = (undefined1 *)pTVar2->type_;
          if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
            puVar13 = Specification::_FeatureType_default_instance_;
          }
          puVar10 = Specification::_ImageFeatureType_default_instance_;
          if (((FeatureType *)puVar13)->_oneof_case_[0] == 4) {
            puVar10 = (undefined1 *)(((FeatureType *)puVar13)->Type_).imagetype_;
          }
          ShapeConstraint::setWidth(pmVar3,((ImageFeatureType *)puVar10)->width_);
        }
        else {
          puVar10 = Specification::_ArrayFeatureType_default_instance_;
          if (((FeatureType *)puVar13)->_oneof_case_[0] == 5) {
            puVar10 = (undefined1 *)(((FeatureType *)puVar13)->Type_).multiarraytype_;
          }
          iVar11 = (((ArrayFeatureType *)puVar10)->shape_).current_size_;
          if (iVar11 == 1) {
            psVar7 = (size_t *)
                     google::protobuf::RepeatedField<long>::elements
                               (&((ArrayFeatureType *)puVar10)->shape_);
            ShapeConstraint::setChannel(pmVar3,*psVar7);
            sVar14 = 1;
            ShapeConstraint::setHeight(pmVar3,1);
          }
          else {
            if (iVar11 != 3) goto LAB_00314fc6;
            psVar7 = (size_t *)
                     google::protobuf::RepeatedField<long>::elements
                               (&((ArrayFeatureType *)puVar10)->shape_);
            ShapeConstraint::setChannel(pmVar3,*psVar7);
            puVar13 = (undefined1 *)pTVar2->type_;
            if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
              puVar13 = Specification::_FeatureType_default_instance_;
            }
            puVar10 = Specification::_ArrayFeatureType_default_instance_;
            if (((FeatureType *)puVar13)->_oneof_case_[0] == 5) {
              puVar10 = (undefined1 *)(((FeatureType *)puVar13)->Type_).multiarraytype_;
            }
            if ((((ArrayFeatureType *)puVar10)->shape_).current_size_ < 2) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_a0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x280);
              pLVar8 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_a0,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar8);
              google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
            }
            plVar9 = google::protobuf::RepeatedField<long>::elements
                               (&((ArrayFeatureType *)puVar10)->shape_);
            ShapeConstraint::setHeight(pmVar3,plVar9[1]);
            puVar13 = (undefined1 *)pTVar2->type_;
            if ((FeatureType *)puVar13 == (FeatureType *)0x0) {
              puVar13 = Specification::_FeatureType_default_instance_;
            }
            puVar10 = Specification::_ArrayFeatureType_default_instance_;
            if (((FeatureType *)puVar13)->_oneof_case_[0] == 5) {
              puVar10 = (undefined1 *)(((FeatureType *)puVar13)->Type_).multiarraytype_;
            }
            if ((((ArrayFeatureType *)puVar10)->shape_).current_size_ < 3) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x280);
              pLVar8 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_68,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar8);
              google::protobuf::internal::LogMessage::~LogMessage(&local_68);
            }
            plVar9 = google::protobuf::RepeatedField<long>::elements
                               (&((ArrayFeatureType *)puVar10)->shape_);
            sVar14 = plVar9[2];
          }
          ShapeConstraint::setWidth(pmVar3,sVar14);
        }
      }
LAB_00314fc6:
      iVar12 = iVar12 + 1;
    } while (iVar12 < (local_108->output_).super_RepeatedPtrFieldBase.current_size_);
  }
  return;
}

Assistant:

NeuralNetworkShaper::NeuralNetworkShaper(const Specification::ModelDescription& interface, const google::protobuf::RepeatedPtrField<Specification::NeuralNetworkLayer>& layers, bool useInputAndOutputConstraints)
    :
    numColors(interface.input().size())
{

    for (int i = 0; i < interface.input().size(); i++) {
        const Specification::FeatureDescription& desc = interface.input(i);

        ShapeConstraint& constraint = blobShapes[desc.name()];
        constraint.setName(desc.name());
        // Each input blob starts as it's own color
        blobColors[desc.name()].insert(i);

        if (useInputAndOutputConstraints) {
            constraint.updateConstraint(desc.type());
        }

    }

    bool done = false;

    while (!done) {

        std::map<std::string, std::set<int> > blobColorsCopy = blobColors;

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << "=====================" << std::endl << "Computing neural network shapes" << std::endl  << "=====================" << std::endl;
        std::cout << std::endl << "Starting forward computation of neural network shapes" << std::endl << std::endl;
#endif

        // forward pass
        for (int i = 0; i < layers.size(); i++){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsDown(layer);
            ProcessLayer(layer);
        } // loop over layers

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << std::endl << "Starting backward computation of neural network shapes" << std::endl << std::endl;
#endif

        // backward pass
        for (int i = layers.size() - 1; i >= 0; i--){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsUp(layer);
            ProcessLayer(layer);
        } // loop over layers

        done = AllShapesDone();

        if (blobColorsCopy == blobColors) {
            break;
        }
    }

    if (useInputAndOutputConstraints) {
        for (int i = 0; i < interface.output().size(); i++) {
            const Specification::FeatureDescription& desc = interface.output(i);

            // skip over names that are just for the classifier
            if (desc.name().compare(interface.predictedprobabilitiesname()) == 0
                || desc.name().compare(interface.predictedfeaturename()) == 0) {
                continue;
            }
            
            // using at because it needs to exist, this will throw if it doesn't
            if (blobShapes.find(desc.name()) == blobShapes.end()) {
                continue;
            }
            ShapeConstraint& constraint = blobShapes.at(desc.name());

            // TODO: add a catch with an error message that mentions the name

            if (desc.type().Type_case() == Specification::FeatureType::kImageType) {
                // sequence constraint here is unbounded
                // batch is unbounded
                // other three read from the constraint as is -- later to be updated with flexibility
                auto colorspace = desc.type().imagetype().colorspace();
                if (colorspace == Specification::ImageFeatureType_ColorSpace_GRAYSCALE ||
                    colorspace == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16)
                    constraint.setChannel(1);
                else {
                    constraint.setChannel(3);
                }
                constraint.setHeight(static_cast<size_t>(desc.type().imagetype().height()));
                constraint.setWidth(static_cast<size_t>(desc.type().imagetype().width()));
            }
            else { // assuming it's a multi array

                // allowing for the possibility that output shapes aren't constrained
                if (desc.type().multiarraytype().shape_size() == 3) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(static_cast<size_t>(desc.type().multiarraytype().shape(1)));
                    constraint.setWidth(static_cast<size_t>(desc.type().multiarraytype().shape(2)));
                }
                else if (desc.type().multiarraytype().shape_size() == 1) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(1);
                    constraint.setWidth(1);
                }
            }
        }
    }

}